

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O1

bool __thiscall FMultiPatchTexture::UseBasePalette(FMultiPatchTexture *this)

{
  undefined8 *puVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  if (((this->super_FTexture).field_0x32 & 1) == 0) {
    bVar4 = this->NumParts < 1;
    if ((0 < this->NumParts) &&
       (iVar3 = (*this->Parts->Texture->_vptr_FTexture[5])(), (char)iVar3 != '\0')) {
      lVar5 = 0x40;
      lVar6 = 0;
      do {
        lVar6 = lVar6 + 1;
        bVar4 = this->NumParts <= lVar6;
        if (this->NumParts <= lVar6) {
          return bVar4;
        }
        puVar1 = (undefined8 *)((long)&this->Parts->OriginX + lVar5);
        lVar5 = lVar5 + 0x28;
        cVar2 = (**(code **)(*(long *)*puVar1 + 0x28))();
      } while (cVar2 != '\0');
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool FMultiPatchTexture::UseBasePalette() 
{ 
	if (bComplex) return false;
	for(int i=0;i<NumParts;i++)
	{
		if (!Parts[i].Texture->UseBasePalette()) return false;
	}
	return true;
}